

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglQueryConfigTests.cpp
# Opt level: O0

void __thiscall
deqp::egl::GetConfigsBoundsCase::GetConfigsBoundsCase
          (GetConfigsBoundsCase *this,EglTestContext *eglTestCtx,char *name,char *description)

{
  Library *egl;
  TestContext *this_00;
  TestLog *log;
  char *description_local;
  char *name_local;
  EglTestContext *eglTestCtx_local;
  GetConfigsBoundsCase *this_local;
  
  egl::TestCase::TestCase(&this->super_TestCase,eglTestCtx,name,description);
  egl = EglTestContext::getLibrary(eglTestCtx);
  this_00 = EglTestContext::getTestContext(eglTestCtx);
  log = tcu::TestContext::getLog(this_00);
  eglu::CallLogWrapper::CallLogWrapper(&this->super_CallLogWrapper,egl,log);
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__GetConfigsBoundsCase_0327b210;
  this->m_display = (EGLDisplay)0x0;
  return;
}

Assistant:

GetConfigsBoundsCase (EglTestContext& eglTestCtx, const char* name, const char* description)
		: TestCase		(eglTestCtx, name, description)
		, CallLogWrapper(eglTestCtx.getLibrary(), eglTestCtx.getTestContext().getLog())
		, m_display		(EGL_NO_DISPLAY)
	{
	}